

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPDBrecs.c
# Opt level: O1

void parseSegID(char *line,char *id)

{
  int iVar1;
  size_t sVar2;
  char cVar3;
  char cVar4;
  
  sVar2 = strlen(line);
  cVar3 = ' ';
  cVar4 = ' ';
  iVar1 = (int)sVar2;
  if (0x48 < iVar1) {
    cVar4 = line[0x48];
  }
  *id = cVar4;
  if (0x49 < iVar1) {
    cVar3 = line[0x49];
  }
  id[1] = cVar3;
  cVar3 = ' ';
  cVar4 = ' ';
  if (0x4a < iVar1) {
    cVar4 = line[0x4a];
  }
  id[2] = cVar4;
  if (0x4b < iVar1) {
    cVar3 = line[0x4b];
  }
  id[3] = cVar3;
  id[4] = '\0';
  return;
}

Assistant:

void parseSegID(char *line, char id[]) {
   int reclen = strlen(line);
   id[0] = (reclen >= 73) ? line[72] : ' ';
   id[1] = (reclen >= 74) ? line[73] : ' ';
   id[2] = (reclen >= 75) ? line[74] : ' ';
   id[3] = (reclen >= 76) ? line[75] : ' ';
   id[4] = '\0';
}